

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *window,int n)

{
  ImGuiID IVar1;
  uint uVar2;
  long lVar3;
  int local_c;
  
  local_c = n;
  if ((uint)n < 8) {
    lVar3 = 0;
    IVar1 = ImHashStr("#RESIZE",0,window->ID);
    uVar2 = ~IVar1;
    do {
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[(uint)*(byte *)((long)&local_c + lVar3) ^ uVar2 & 0xff]
      ;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    return ~uVar2;
  }
  __assert_fail("n >= 0 && n <= 7",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0x1441,"ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *, int)");
}

Assistant:

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n <= 7);
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}